

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::MultisampleTextureDependenciesNoErrorGeneratedForValidFramebufferTexture2DCallsTest::iterate
          (MultisampleTextureDependenciesNoErrorGeneratedForValidFramebufferTexture2DCallsTest *this
          )

{
  uint uVar1;
  GLenum GVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  undefined4 local_4c;
  GLenum attachment_type;
  GLint samples;
  GLenum internalformat;
  uint n_internalformat;
  uint n_internalformats;
  GLenum internalformats [6];
  GLint gl_max_internalformat_samples;
  Functions *gl;
  MultisampleTextureDependenciesNoErrorGeneratedForValidFramebufferTexture2DCallsTest *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  initInternals(this);
  internalformats[5] = 0;
  _n_internalformat = 0x8d6200008051;
  internalformats[0] = 0x8c43;
  internalformats[1] = 0x8cac;
  internalformats[2] = 0x88f0;
  internalformats[3] = 0x8d82;
  for (samples = 0; (uint)samples < 6; samples = samples + 1) {
    uVar1 = (&n_internalformat)[(uint)samples];
    (**(code **)(lVar6 + 0x880))(0x9100,uVar1,0x80a9,1,internalformats + 5);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,
                    "Could not retrieve maximum supported amount of samples for internal format",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                    ,0x819);
    GVar2 = internalformats[5];
    if (1 < (int)internalformats[5]) {
      (**(code **)(lVar6 + 0x6f8))(1,&this->to_id);
      (**(code **)(lVar6 + 0xb8))(0x9100,this->to_id);
      (**(code **)(lVar6 + 0x1390))(0x9100,GVar2,uVar1,1,1,0);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"Could not set up a texture object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                      ,0x82b);
      local_4c = 0x8ce0;
      if (uVar1 == 0x8cac) {
        local_4c = 0x8d00;
      }
      else if (uVar1 == 0x88f0) {
        local_4c = 0x821a;
      }
      (**(code **)(lVar6 + 0x6a0))(0x8ca9,local_4c,0x9100,this->to_id,0);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glFramebufferTexture2D() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                      ,0x83c);
      (**(code **)(lVar6 + 0xb8))(0x9100,0);
      (**(code **)(lVar6 + 0x480))(1,&this->to_id);
      this->to_id = 0;
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"Could not release the texture object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                      ,0x844);
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureDependenciesNoErrorGeneratedForValidFramebufferTexture2DCallsTest::
	iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* For storing format specific maximum number of samples */
	glw::GLint gl_max_internalformat_samples = 0;

	/* Iterate through all internalformats */
	const glw::GLenum internalformats[] = {
		GL_RGB8, GL_RGB565, GL_SRGB8_ALPHA8, GL_DEPTH_COMPONENT32F, GL_DEPTH24_STENCIL8, GL_RGBA32I
	};
	const unsigned int n_internalformats = sizeof(internalformats) / sizeof(internalformats[0]);

	for (unsigned int n_internalformat = 0; n_internalformat < n_internalformats; ++n_internalformat)
	{
		glw::GLenum internalformat = internalformats[n_internalformat];

		/* Determine a value to be used for samples argument in subsequent
		 * glTexStorage2DMultisample() call. */
		gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, internalformat, GL_SAMPLES, 1,
							   &gl_max_internalformat_samples);

		GLU_EXPECT_NO_ERROR(gl.getError(),
							"Could not retrieve maximum supported amount of samples for internal format");

		glw::GLint samples = gl_max_internalformat_samples;

		/* Skip formats that are not multisampled in implementation */
		if (samples <= 1)
		{
			continue;
		}

		/* Set up a texture object. */
		gl.genTextures(1, &to_id);
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id);

		gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, samples, internalformat, 1, /* width */
								   1,													  /* height */
								   GL_FALSE);											  /* fixedsamplelocations */

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a texture object");

		/* Determine attachment type for internalformat considered */
		glw::GLenum attachment_type = GL_COLOR_ATTACHMENT0;

		if (internalformat == GL_DEPTH_COMPONENT32F)
		{
			attachment_type = GL_DEPTH_ATTACHMENT;
		}
		else if (internalformat == GL_DEPTH24_STENCIL8)
		{
			attachment_type = GL_DEPTH_STENCIL_ATTACHMENT;
		}

		/* Attach it to the FBO */
		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, attachment_type, GL_TEXTURE_2D_MULTISAMPLE, to_id, 0); /* level */

		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

		/* Release the texture object */
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);
		gl.deleteTextures(1, &to_id);

		to_id = 0;

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not release the texture object");
	} /* for (all internalformats) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}